

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O0

int run_test_pipe_bind_error_addrinuse(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_1e0 [4];
  int r;
  uv_pipe_t server2;
  uv_pipe_t server1;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&server2.pipe_fname,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x33,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_bind(&server2.pipe_fname,"/tmp/uv-test-sock");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x35,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,local_1e0,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x38,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_bind(local_1e0,"/tmp/uv-test-sock");
  if ((long)iVar1 != -0x62) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x3a,"r","==","UV_EADDRINUSE",(long)iVar1,"==",0xffffffffffffff9e);
    abort();
  }
  iVar1 = uv_listen(&server2.pipe_fname,0x1000,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x3d,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen(local_1e0,0x1000,0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x3f,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  uv_close(&server2.pipe_fname,close_cb);
  uv_close(local_1e0,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x46,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
            ,0x48,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_bind_error_addrinuse) {
  uv_pipe_t server1, server2;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server1, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server1, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_pipe_init(uv_default_loop(), &server2, 0);
  ASSERT_OK(r);
  r = uv_pipe_bind(&server2, TEST_PIPENAME);
  ASSERT_EQ(r, UV_EADDRINUSE);

  r = uv_listen((uv_stream_t*)&server1, SOMAXCONN, NULL);
  ASSERT_OK(r);
  r = uv_listen((uv_stream_t*)&server2, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}